

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partiallock.cc
# Opt level: O1

int plock_destroy(plock *plock)

{
  list_elem *plVar1;
  list_elem *plVar2;
  
  if (plock == (plock *)0x0) {
    return -1;
  }
  (*plock->ops->destroy_internal)(plock->lock);
  plVar2 = (plock->active).head;
  while (plVar2 != (list_elem *)0x0) {
    plVar1 = plVar2->next;
    (*plock->ops->unlock_user)(plVar2[-2].prev);
    (*plock->ops->destroy_user)(plVar2[-2].prev);
    free(plVar2[-2].next);
    free(plVar2[-1].prev);
    free(plVar2[-2].prev);
    free(plVar2 + -2);
    plVar2 = plVar1;
  }
  plVar2 = (plock->inactive).head;
  while (plVar2 != (list_elem *)0x0) {
    plVar1 = plVar2->next;
    (*plock->ops->destroy_user)(plVar2[-2].prev);
    free(plVar2[-2].next);
    free(plVar2[-1].prev);
    free(plVar2[-2].prev);
    free(plVar2 + -2);
    plVar2 = plVar1;
  }
  free(plock->lock);
  free(plock->ops);
  return 0;
}

Assistant:

int plock_destroy(struct plock *plock)
{
    struct list_elem *le;
    struct plock_node *node;

    if (!plock) {
        return PLOCK_RESULT_INVALID_ARGS;
    }

    plock->ops->destroy_internal(plock->lock);

    // free all active locks
    le = list_begin(&plock->active);
    while(le) {
        node = _get_entry(le, struct plock_node, le);
        le = list_next(le);

        // unlock and destroy
        plock->ops->unlock_user(node->lock);
        plock->ops->destroy_user(node->lock);
        free(node->start);
        free(node->len);
        free(node->lock);
        free(node);
    }

    // free all inactive locks
    le = list_begin(&plock->inactive);
    while(le) {
        node = _get_entry(le, struct plock_node, le);
        le = list_next(le);

        // destroy
        plock->ops->destroy_user(node->lock);
        free(node->start);
        free(node->len);
        free(node->lock);
        free(node);
    }

    // free plock
    free(plock->lock);
    free(plock->ops);

    return PLOCK_RESULT_SUCCESS;
}